

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int unGetc(int c)

{
  undefined8 in_RAX;
  int in_EDI;
  undefined4 unaff_retaddr;
  char *s2;
  int iVar1;
  
  s2 = (char *)CONCAT44((int)((ulong)in_RAX >> 0x20),in_EDI);
  if (in_EDI == -1) {
    iVar1 = -1;
  }
  else {
    if (inlinebuf + whichbuf < ctp) {
      ctp = ctp + -1;
      *ctp = (char)in_EDI;
    }
    else {
      diag((char *)CONCAT44(unaff_retaddr,c),s2);
    }
    iVar1 = (int)s2;
  }
  return iVar1;
}

Assistant:

int unGetc(c)
	int             c;
{
	if (c == EOF)
		return c;
	if (ctp > inlinebuf[whichbuf]) {
		ctp--;
		*ctp = c;
	} else {
		diag("internal error in unGetc", "");
	}
	return c;
}